

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimate.cc
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  size_t sVar5;
  int iVar6;
  string *this;
  int iVar7;
  char *__s;
  int vector_length;
  int start_index;
  int decimation_period;
  vector<double,_std::allocator<double>_> input_data;
  ostringstream error_message_6;
  ifstream ifs;
  int local_3f4;
  int local_3f0;
  int local_3ec;
  string local_3e8;
  vector<double,_std::allocator<double>_> local_3c8;
  string local_3b0 [3];
  ios_base local_340 [264];
  string local_238;
  byte abStack_218 [80];
  ios_base local_1c8 [408];
  
  local_3f0 = 0;
  local_3f4 = 1;
  local_3ec = 10;
  iVar7 = 0;
  do {
    iVar4 = ya_getopt_long(argc,argv,"l:m:s:p:h",(option *)0x0,(int *)0x0);
    switch(iVar4) {
    case 0x68:
      anon_unknown.dwarf_2bbc::PrintUsage((ostream *)&std::cout);
      iVar7 = 0;
      iVar6 = 1;
      break;
    case 0x69:
    case 0x6a:
    case 0x6b:
    case 0x6e:
    case 0x6f:
    case 0x71:
    case 0x72:
switchD_001026ff_caseD_69:
      anon_unknown.dwarf_2bbc::PrintUsage((ostream *)&std::cerr);
      goto LAB_00102a1d;
    case 0x6c:
      std::__cxx11::string::string((string *)&local_238,ya_optarg,(allocator *)local_3b0);
      bVar3 = sptk::ConvertStringToInteger(&local_238,&local_3f4);
      bVar1 = local_3f4 < 1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p);
      }
      if (!bVar3 || bVar1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_238,"The argument for the -l option must be a positive integer"
                   ,0x39);
        local_3b0[0]._M_dataplus._M_p = (pointer)&local_3b0[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,"decimate","");
        sptk::PrintErrorMessage(local_3b0,(ostringstream *)&local_238);
        goto LAB_001029f2;
      }
LAB_00102938:
      iVar6 = 0;
      break;
    case 0x6d:
      std::__cxx11::string::string((string *)&local_238,ya_optarg,(allocator *)local_3b0);
      bVar1 = sptk::ConvertStringToInteger(&local_238,&local_3f4);
      bVar3 = -1 < local_3f4;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p);
      }
      if (bVar1 && bVar3) {
        local_3f4 = local_3f4 + 1;
        goto LAB_00102938;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_238,"The argument for the -m option must be a ",0x29);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_238,"non-negative integer",0x14);
      local_3b0[0]._M_dataplus._M_p = (pointer)&local_3b0[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,"decimate","");
      sptk::PrintErrorMessage(local_3b0,(ostringstream *)&local_238);
      goto LAB_001029f2;
    case 0x70:
      std::__cxx11::string::string((string *)&local_238,ya_optarg,(allocator *)local_3b0);
      bVar3 = sptk::ConvertStringToInteger(&local_238,&local_3ec);
      bVar1 = 0 < local_3ec;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p);
      }
      if (bVar3 && bVar1) goto LAB_00102938;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_238,"The argument for the -p option must be a positive integer",
                 0x39);
      local_3b0[0]._M_dataplus._M_p = (pointer)&local_3b0[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,"decimate","");
      sptk::PrintErrorMessage(local_3b0,(ostringstream *)&local_238);
      goto LAB_001029f2;
    case 0x73:
      std::__cxx11::string::string((string *)&local_238,ya_optarg,(allocator *)local_3b0);
      bVar1 = sptk::ConvertStringToInteger(&local_238,&local_3f0);
      bVar3 = -1 < local_3f0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p);
      }
      if (bVar1 && bVar3) goto LAB_00102938;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_238,"The argument for the -s option must be a ",0x29);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_238,"non-negative integer",0x14);
      local_3b0[0]._M_dataplus._M_p = (pointer)&local_3b0[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,"decimate","");
      sptk::PrintErrorMessage(local_3b0,(ostringstream *)&local_238);
LAB_001029f2:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b0[0]._M_dataplus._M_p != &local_3b0[0].field_2) {
        operator_delete(local_3b0[0]._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_238);
      std::ios_base::~ios_base(local_1c8);
LAB_00102a1d:
      iVar6 = 1;
      iVar7 = 1;
      break;
    default:
      iVar6 = 2;
      if (iVar4 != -1) goto switchD_001026ff_caseD_69;
    }
  } while (iVar6 == 0);
  if (iVar6 == 2) {
    if (argc - ya_optind < 2) {
      if (argc == ya_optind) {
        __s = (char *)0x0;
      }
      else {
        __s = argv[ya_optind];
      }
      bVar1 = sptk::SetBinaryMode();
      this = &local_238;
      if (bVar1) {
        std::ifstream::ifstream(this);
        if ((__s == (char *)0x0) ||
           (std::ifstream::open((char *)&local_238,(_Ios_Openmode)__s),
           (abStack_218[*(long *)(local_238._M_dataplus._M_p + -0x18)] & 5) == 0)) {
          cVar2 = std::__basic_file<char>::is_open();
          if (cVar2 == '\0') {
            this = (string *)&std::cin;
          }
          std::vector<double,_std::allocator<double>_>::vector
                    (&local_3c8,(long)local_3f4,(allocator_type *)local_3b0);
          bVar1 = 0 < local_3f0;
          if (0 < local_3f0) {
            iVar4 = 0;
            do {
              bVar3 = sptk::ReadStream<double>
                                (false,0,0,local_3f4,&local_3c8,(istream *)this,(int *)0x0);
              if (!bVar3) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_3b0,"Start index exceeds data length",0x1f);
                local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e8,"decimate","");
                sptk::PrintErrorMessage(&local_3e8,(ostringstream *)local_3b0);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
                  operator_delete(local_3e8._M_dataplus._M_p);
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b0);
                std::ios_base::~ios_base(local_340);
                iVar7 = 1;
                break;
              }
              iVar4 = iVar4 + 1;
              bVar1 = iVar4 < local_3f0;
            } while (iVar4 < local_3f0);
          }
          if (!bVar1) {
            iVar7 = 0;
            while (bVar1 = sptk::ReadStream<double>
                                     (false,0,0,local_3f4,&local_3c8,(istream *)this,(int *)0x0),
                  bVar1) {
              if (iVar7 % local_3ec == 0) {
                bVar1 = sptk::WriteStream<double>
                                  (0,local_3f4,&local_3c8,(ostream *)&std::cout,(int *)0x0);
                iVar7 = 0;
                if (!bVar1) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3b0,"Failed to write decimated data sequence",0x27);
                  local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_3e8,"decimate","");
                  sptk::PrintErrorMessage(&local_3e8,(ostringstream *)local_3b0);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
                    operator_delete(local_3e8._M_dataplus._M_p);
                  }
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b0);
                  std::ios_base::~ios_base(local_340);
                  iVar7 = 1;
                  goto LAB_00102e1a;
                }
              }
              iVar7 = iVar7 + 1;
            }
            iVar7 = 0;
          }
LAB_00102e1a:
          if (local_3c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_3c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_3b0,"Cannot open file ",0x11);
          sVar5 = strlen(__s);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3b0,__s,sVar5);
          local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e8,"decimate","");
          sptk::PrintErrorMessage(&local_3e8,(ostringstream *)local_3b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
            operator_delete(local_3e8._M_dataplus._M_p);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b0);
          std::ios_base::~ios_base(local_340);
          iVar7 = 1;
        }
        std::ifstream::~ifstream(&local_238);
        return iVar7;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this,"Cannot set translation mode",0x1b);
      local_3b0[0]._M_dataplus._M_p = (pointer)&local_3b0[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,"decimate","");
      sptk::PrintErrorMessage(local_3b0,(ostringstream *)&local_238);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_238,"Too many input files",0x14);
      local_3b0[0]._M_dataplus._M_p = (pointer)&local_3b0[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,"decimate","");
      sptk::PrintErrorMessage(local_3b0,(ostringstream *)&local_238);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b0[0]._M_dataplus._M_p != &local_3b0[0].field_2) {
      operator_delete(local_3b0[0]._M_dataplus._M_p);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_238);
    std::ios_base::~ios_base(local_1c8);
    iVar7 = 1;
  }
  return iVar7;
}

Assistant:

int main(int argc, char* argv[]) {
  int start_index(kDefaultStartIndex);
  int vector_length(kDefaultVectorLength);
  int decimation_period(kDefaultDecimationPeriod);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "l:m:s:p:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &vector_length) ||
            vector_length <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -l option must be a positive integer";
          sptk::PrintErrorMessage("decimate", error_message);
          return 1;
        }
        break;
      }
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &vector_length) ||
            vector_length < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("decimate", error_message);
          return 1;
        }
        ++vector_length;
        break;
      }
      case 's': {
        if (!sptk::ConvertStringToInteger(optarg, &start_index) ||
            start_index < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -s option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("decimate", error_message);
          return 1;
        }
        break;
      }
      case 'p': {
        if (!sptk::ConvertStringToInteger(optarg, &decimation_period) ||
            decimation_period <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -p option must be a positive integer";
          sptk::PrintErrorMessage("decimate", error_message);
          return 1;
        }
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const int num_input_files(argc - optind);
  if (1 < num_input_files) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("decimate", error_message);
    return 1;
  }
  const char* input_file(0 == num_input_files ? NULL : argv[optind]);

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("decimate", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("decimate", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  std::vector<double> input_data(vector_length);

  // Skip data.
  for (int sample_index(0); sample_index < start_index; ++sample_index) {
    if (!sptk::ReadStream(false, 0, 0, vector_length, &input_data,
                          &input_stream, NULL)) {
      std::ostringstream error_message;
      error_message << "Start index exceeds data length";
      sptk::PrintErrorMessage("decimate", error_message);
      return 1;
    }
  }

  for (int sample_index(0); sptk::ReadStream(false, 0, 0, vector_length,
                                             &input_data, &input_stream, NULL);
       ++sample_index) {
    if (0 == sample_index % decimation_period) {
      if (!sptk::WriteStream(0, vector_length, input_data, &std::cout, NULL)) {
        std::ostringstream error_message;
        error_message << "Failed to write decimated data sequence";
        sptk::PrintErrorMessage("decimate", error_message);
        return 1;
      }
      sample_index = 0;
    }
  }

  return 0;
}